

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

DesugaredObject * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::DesugaredObject,jsonnet::internal::LocationRange&,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>&,std::vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>&>
          (Allocator *this,LocationRange *args,
          list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *args_1,
          vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
          *args_2)

{
  size_t *psVar1;
  DesugaredObject *this_00;
  _List_node_base *p_Var2;
  
  this_00 = (DesugaredObject *)operator_new(0xb0);
  DesugaredObject::DesugaredObject(this_00,args,args_1,args_2);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }